

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CService::SetSockAddr(CService *this,sockaddr *paddr)

{
  bool bVar1;
  long in_FS_OFFSET;
  CService local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (paddr->sa_family == 10) {
    CService(&local_40,(sockaddr_in6 *)paddr);
  }
  else {
    if (paddr->sa_family != 2) {
      bVar1 = false;
      goto LAB_00597548;
    }
    CService(&local_40,(sockaddr_in *)paddr);
  }
  operator=(this,&local_40);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_40);
  bVar1 = true;
LAB_00597548:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CService::SetSockAddr(const struct sockaddr *paddr)
{
    switch (paddr->sa_family) {
    case AF_INET:
        *this = CService(*(const struct sockaddr_in*)paddr);
        return true;
    case AF_INET6:
        *this = CService(*(const struct sockaddr_in6*)paddr);
        return true;
    default:
        return false;
    }
}